

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
          (StringTree *__return_storage_ptr__,StringTree *this,CappedArray<char,_14UL> *params,
          ArrayPtr<const_char> *params_1,CappedArray<char,_14UL> *params_2,
          ArrayPtr<const_char> *params_3,CappedArray<char,_26UL> *params_4,
          ArrayPtr<const_char> *params_5,CappedArray<char,_26UL> *params_6)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  size_t __n;
  CappedArray<char,_14UL> *rest_1;
  Branch *pBVar4;
  size_t result;
  size_t sVar5;
  long lVar6;
  size_t result_2;
  char *pos;
  size_t local_98 [2];
  char *local_88;
  undefined8 uStack_80;
  char *local_78;
  undefined8 uStack_70;
  char *local_68;
  String local_60;
  CappedArray<char,_14UL> *local_48;
  CappedArray<char,_14UL> *local_40;
  CappedArray<char,_14UL> *local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_98[0] = this->size_;
  local_98[1] = *(size_t *)params->content;
  local_88 = params_1->ptr;
  uStack_80 = *(undefined8 *)params_2->content;
  local_78 = params_3->ptr;
  uStack_70 = *(undefined8 *)params_4->content;
  local_68 = params_5->ptr;
  sVar5 = 0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_98 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x38);
  __return_storage_ptr__->size_ = sVar5;
  sVar5 = 0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_98 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x38);
  local_40 = params;
  local_38 = (CappedArray<char,_14UL> *)params_1;
  heapString(&local_60,sVar5);
  (__return_storage_ptr__->text).content.ptr = local_60.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_60.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_60.content.disposer;
  local_78 = (char *)0x0;
  uStack_70 = 0;
  local_88 = (char *)0x0;
  uStack_80 = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_68 = (char *)0x0;
  sVar5 = 0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_98 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x38);
  local_48 = params_2;
  pBVar4 = (Branch *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x40,sVar5,sVar5,
                      kj::_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::construct,
                      ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_60.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_60.content.ptr = (char *)pBVar4;
  local_60.content.size_ = sVar5;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  rest_1 = local_48;
  (__return_storage_ptr__->branches).ptr = pBVar4;
  (__return_storage_ptr__->branches).size_ = sVar5;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance
  ;
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  __n = this->size_;
  if (__n != 0) {
    memcpy(pos,&this->text,__n);
    pos = pos + __n;
  }
  fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,pos,0,(ArrayPtr<const_char> *)local_40,local_38,
             (ArrayPtr<const_char> *)rest_1,(CappedArray<char,_26UL> *)params_3,
             (ArrayPtr<const_char> *)params_4,(CappedArray<char,_26UL> *)params_5);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}